

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__10,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  string *psVar2;
  FieldDescriptor *pFVar3;
  ulong uVar4;
  char *pcVar5;
  string_view format;
  Arg *in_stack_ffffffffffffff10;
  Arg local_e8;
  Arg local_b8;
  Arg local_88;
  Arg local_58;
  
  pFVar3 = google::protobuf::DescriptorPool::Tables::FindExtension
                     (*(Tables **)(*(long *)this + 8),*(Descriptor **)(**(long **)(this + 8) + 0x20)
                      ,*(int *)(**(long **)(this + 8) + 4));
  lVar1 = *(long *)(**(long **)(this + 8) + 0x20);
  if (lVar1 == 0) {
    pcVar5 = "unknown";
    uVar4 = 7;
  }
  else {
    lVar1 = *(long *)(lVar1 + 0x10);
    uVar4 = (ulong)*(ushort *)(lVar1 + 2);
    pcVar5 = (char *)(~uVar4 + lVar1);
  }
  substitute_internal::Arg::Arg(&local_58,*(int *)(**(long **)(this + 8) + 4));
  local_b8.piece_._M_str = (pFVar3->all_names_).payload_;
  local_b8.piece_._M_len = (size_t)*(ushort *)(local_b8.piece_._M_str + 2);
  local_b8.piece_._M_str = local_b8.piece_._M_str + ~local_b8.piece_._M_len;
  psVar2 = pFVar3->file_->name_;
  local_e8.piece_._M_str = (psVar2->_M_dataplus)._M_p;
  local_e8.piece_._M_len = psVar2->_M_string_length;
  format._M_str = (char *)&local_58;
  format._M_len =
       (size_t)
       "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3.";
  local_88.piece_._M_len = uVar4;
  local_88.piece_._M_str = pcVar5;
  Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0x52,format,&local_88,&local_b8,&local_e8,
             in_stack_ffffffffffffff10);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}